

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2_core.c
# Opt level: O1

void rxa2_free_memory(argon2_context *context,uint8_t *memory,size_t num,size_t size)

{
  if (context->free_cbk != (deallocate_fptr)0x0) {
    (*context->free_cbk)(memory,size * num);
    return;
  }
  free(memory);
  return;
}

Assistant:

void rxa2_free_memory(const argon2_context *context, uint8_t *memory,
	size_t num, size_t size) {
	size_t memory_size = num * size;
	rxa2_clear_internal_memory(memory, memory_size);
	if (context->free_cbk) {
		(context->free_cbk)(memory, memory_size);
	}
	else {
		free(memory);
	}
}